

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

string * __thiscall
HTTPRequest::ReadBody_abi_cxx11_(string *__return_storage_ptr__,HTTPRequest *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = evhttp_request_get_input_buffer(this->req);
  if (lVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    lVar3 = evbuffer_get_length(lVar2);
    lVar4 = evbuffer_pullup(lVar2,lVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (lVar4 != 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,lVar4,lVar4 + lVar3);
      evbuffer_drain(lVar2,lVar3);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_0047fe4e;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
LAB_0047fe4e:
  __stack_chk_fail();
}

Assistant:

std::string HTTPRequest::ReadBody()
{
    struct evbuffer* buf = evhttp_request_get_input_buffer(req);
    if (!buf)
        return "";
    size_t size = evbuffer_get_length(buf);
    /** Trivial implementation: if this is ever a performance bottleneck,
     * internal copying can be avoided in multi-segment buffers by using
     * evbuffer_peek and an awkward loop. Though in that case, it'd be even
     * better to not copy into an intermediate string but use a stream
     * abstraction to consume the evbuffer on the fly in the parsing algorithm.
     */
    const char* data = (const char*)evbuffer_pullup(buf, size);
    if (!data) // returns nullptr in case of empty buffer
        return "";
    std::string rv(data, size);
    evbuffer_drain(buf, size);
    return rv;
}